

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::ParseEntities(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  LineReader *pLVar2;
  LineReader *pLVar3;
  Logger *this_00;
  char *local_1c8 [4];
  undefined1 local_1a8 [16];
  pointer local_198;
  pointer pIStack_190;
  pointer local_188;
  pointer pIStack_180;
  _Alloc_hider local_178;
  size_type sStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined1 local_158 [296];
  
  local_178._M_p = (pointer)&local_168;
  sStack_170 = 0;
  local_168._8_8_ = 0;
  local_158._8_8_ = 0;
  local_188 = (pointer)0x0;
  pIStack_180 = (pointer)0x0;
  local_198 = (pointer)0x0;
  pIStack_190 = (pointer)0x0;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_168._M_allocated_capacity = 0;
  local_158._0_4_ = 0.0;
  local_158._4_4_ = 0.0;
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::
  emplace_back<Assimp::DXF::Block>(&output->blocks,(Block *)local_1a8);
  DXF::Block::~Block((Block *)local_1a8);
  std::__cxx11::string::assign
            ((char *)&(output->blocks).
                      super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].name);
  while (reader->end < 2) {
    bVar1 = DXF::LineReader::Is(reader,0,"ENDSEC");
    if (bVar1) break;
    bVar1 = DXF::LineReader::Is(reader,0,"POLYLINE");
    if (bVar1) {
      pLVar2 = DXF::LineReader::operator++(reader);
      ParsePolyLine(this,pLVar2,output);
    }
    else {
      bVar1 = DXF::LineReader::Is(reader,0,"INSERT");
      if (bVar1) {
        pLVar2 = reader;
        pLVar3 = DXF::LineReader::operator++(reader);
        ParseInsertion((DXFImporter *)pLVar2,pLVar3,output);
      }
      else {
        bVar1 = DXF::LineReader::Is(reader,0,"3DFACE");
        if (bVar1) {
LAB_004015db:
          pLVar2 = reader;
          pLVar3 = DXF::LineReader::operator++(reader);
          Parse3DFace((DXFImporter *)pLVar2,pLVar3,output);
        }
        else {
          bVar1 = DXF::LineReader::Is(reader,0,"LINE");
          if (bVar1) goto LAB_004015db;
          bVar1 = DXF::LineReader::Is(reader,0,"3DLINE");
          if (bVar1) goto LAB_004015db;
          DXF::LineReader::operator++(reader);
        }
      }
    }
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[10]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [10])"DXF: got ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," polylines and ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," inserted blocks in ENTITIES");
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1c8[0]);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return;
}

Assistant:

void DXFImporter::ParseEntities(DXF::LineReader& reader, DXF::FileData& output) {
    // Push a new block onto the stack.
    output.blocks.push_back( DXF::Block() );
    DXF::Block& block = output.blocks.back();

    block.name = AI_DXF_ENTITIES_MAGIC_BLOCK;

    while( !reader.End() && !reader.Is(0,"ENDSEC")) {
        if (reader.Is(0,"POLYLINE")) {
            ParsePolyLine(++reader,output);
            continue;
        }

        else if (reader.Is(0,"INSERT")) {
            ParseInsertion(++reader,output);
            continue;
        }

        else if (reader.Is(0,"3DFACE") || reader.Is(0,"LINE") || reader.Is(0,"3DLINE")) {
            //http://sourceforge.net/tracker/index.php?func=detail&aid=2970566&group_id=226462&atid=1067632
            Parse3DFace(++reader, output);
            continue;
        }

        ++reader;
    }

    ASSIMP_LOG_DEBUG_F( "DXF: got ", block.lines.size()," polylines and ", block.insertions.size(), 
        " inserted blocks in ENTITIES" );
}